

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

void __thiscall
Potassco::ProgramOptions::ContextError::ContextError
          (ContextError *this,string *ctx,Type t,string *key,string *alt)

{
  pointer pcVar1;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  local_68 = 0;
  local_60 = 0;
  local_70 = &local_60;
  if (ctx->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_70);
    quote(&local_50,ctx);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_70);
  }
  std::__cxx11::string::append((char *)&local_70);
  quote(&local_50,key);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((t == ambiguous_option) && (alt->_M_string_length != 0)) {
    std::__cxx11::string::append((char *)&local_70);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)(alt->_M_dataplus)._M_p);
  }
  std::logic_error::logic_error((logic_error *)this,(string *)&local_70);
  *(undefined ***)&this->super_Error = &PTR__logic_error_0012caa8;
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  *(undefined ***)&this->super_Error = &PTR__ContextError_0012c978;
  (this->ctx_)._M_dataplus._M_p = (pointer)&(this->ctx_).field_2;
  pcVar1 = (ctx->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ctx_,pcVar1,pcVar1 + ctx->_M_string_length);
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->key_,pcVar1,pcVar1 + key->_M_string_length);
  this->type_ = t;
  return;
}

Assistant:

ContextError::ContextError(const std::string& ctx, Type t, const std::string& key, const std::string& alt)
	: Error(format(t, ctx, key, alt))
	, ctx_(ctx)
	, key_(key)
	, type_(t) {
}